

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int analyzeAggregate(Walker *pWalker,Expr *pExpr)

{
  u8 uVar1;
  short sVar2;
  WhereConst *pWVar3;
  Parse *pPVar4;
  AggInfo *pAVar5;
  ExprList *pEVar6;
  Expr *pEVar7;
  uint uVar8;
  int *piVar9;
  AggInfo_col *pAVar10;
  AggInfo_func *pAVar11;
  FuncDef *pFVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  ExprList_item *pEVar17;
  int iVar18;
  bool bVar19;
  int local_38;
  int local_34;
  
  pWVar3 = (pWalker->u).pConst;
  pPVar4 = pWVar3->pParse;
  piVar9 = *(int **)&pWVar3->nConst;
  pAVar5 = (AggInfo *)pWVar3->apExpr;
  uVar1 = pExpr->op;
  if (uVar1 != 0xa4) {
    if (uVar1 == 0xa3) {
      if (((ulong)pWVar3[1].apExpr & 8) != 0) {
        return 0;
      }
      if (pWalker->walkerDepth != (uint)pExpr->op2) {
        return 0;
      }
      pAVar11 = pAVar5->aFunc;
      piVar9 = &pAVar5->nFunc;
      uVar15 = 0;
      iVar13 = -1;
      do {
        iVar18 = *piVar9;
        iVar16 = (int)uVar15;
        if (iVar18 <= iVar16) {
LAB_0017d8e0:
          if (iVar18 <= iVar16) {
            uVar1 = pPVar4->db->enc;
            pAVar11 = (AggInfo_func *)
                      sqlite3ArrayAllocate(pPVar4->db,pAVar5->aFunc,0x18,piVar9,&local_34);
            pAVar5->aFunc = pAVar11;
            uVar15 = (ulong)local_34;
            if (-1 < (long)uVar15) {
              pAVar11[uVar15].pExpr = pExpr;
              iVar18 = pPVar4->nMem + 1;
              pPVar4->nMem = iVar18;
              pAVar11[uVar15].iMem = iVar18;
              if ((pExpr->x).pList == (ExprList *)0x0) {
                iVar18 = 0;
              }
              else {
                iVar18 = ((pExpr->x).pList)->nExpr;
              }
              pFVar12 = sqlite3FindFunction(pPVar4->db,(pExpr->u).zToken,iVar18,uVar1,'\0');
              pAVar11[uVar15].pFunc = pFVar12;
              if ((pExpr->flags & 2) != 0) {
                iVar13 = pPVar4->nTab;
                pPVar4->nTab = iVar13 + 1;
              }
              pAVar11[uVar15].iDistinct = iVar13;
            }
          }
          pExpr->iAgg = (i16)uVar15;
          pExpr->pAggInfo = pAVar5;
          return 1;
        }
        iVar18 = sqlite3ExprCompare((Parse *)0x0,pAVar11->pExpr,pExpr,-1);
        if (iVar18 == 0) {
          iVar18 = *piVar9;
          goto LAB_0017d8e0;
        }
        uVar15 = (ulong)(iVar16 + 1);
        pAVar11 = pAVar11 + 1;
      } while( true );
    }
    if (uVar1 != 0xa2) {
      return 0;
    }
  }
  if (piVar9 != (int *)0x0) {
    iVar13 = 0;
    if (0 < *piVar9) {
      iVar13 = *piVar9;
    }
    piVar9 = piVar9 + 0x12;
    while (bVar19 = iVar13 != 0, iVar13 = iVar13 + -1, bVar19) {
      if (pExpr->iTable == *piVar9) {
        uVar14 = 0;
        uVar8 = pAVar5->nColumn;
        if (pAVar5->nColumn < 1) {
          uVar8 = uVar14;
        }
        piVar9 = &pAVar5->aCol->iColumn;
        goto LAB_0017d805;
      }
      piVar9 = piVar9 + 0x1c;
    }
  }
  return 1;
LAB_0017d805:
  uVar15 = (ulong)uVar14;
  if (uVar8 == uVar14) goto LAB_0017d825;
  if ((piVar9[-1] == pExpr->iTable) && (*piVar9 == (int)pExpr->iColumn)) goto LAB_0017d8cd;
  uVar14 = uVar14 + 1;
  piVar9 = piVar9 + 8;
  goto LAB_0017d805;
LAB_0017d825:
  pAVar10 = (AggInfo_col *)
            sqlite3ArrayAllocate(pPVar4->db,pAVar5->aCol,0x20,&pAVar5->nColumn,&local_38);
  pAVar5->aCol = pAVar10;
  uVar15 = (ulong)local_38;
  if (-1 < (long)uVar15) {
    *(anon_union_8_3_c79b3df9_for_y *)(pAVar10 + uVar15) = pExpr->y;
    iVar13 = pExpr->iTable;
    pAVar10[uVar15].iTable = iVar13;
    sVar2 = pExpr->iColumn;
    pAVar10[uVar15].iColumn = (int)sVar2;
    iVar18 = pPVar4->nMem + 1;
    pPVar4->nMem = iVar18;
    pAVar10[uVar15].iMem = iVar18;
    pAVar10[uVar15].pExpr = pExpr;
    pEVar6 = pAVar5->pGroupBy;
    if (pEVar6 != (ExprList *)0x0) {
      iVar18 = pEVar6->nExpr;
      pEVar17 = pEVar6->a;
      iVar16 = 0;
      if (iVar18 < 1) {
        iVar18 = 0;
        iVar16 = 0;
      }
      for (; iVar18 != iVar16; iVar16 = iVar16 + 1) {
        pEVar7 = pEVar17->pExpr;
        if (((pEVar7->op == 0xa2) && (pEVar7->iTable == iVar13)) && (pEVar7->iColumn == sVar2))
        goto LAB_0017d8ca;
        pEVar17 = pEVar17 + 1;
      }
    }
    iVar16 = pAVar5->nSortingColumn;
    pAVar5->nSortingColumn = iVar16 + 1;
LAB_0017d8ca:
    pAVar10[uVar15].iSorterColumn = iVar16;
  }
LAB_0017d8cd:
  pExpr->pAggInfo = pAVar5;
  pExpr->op = 0xa4;
  pExpr->iAgg = (i16)uVar15;
  return 1;
}

Assistant:

static int analyzeAggregate(Walker *pWalker, Expr *pExpr){
  int i;
  NameContext *pNC = pWalker->u.pNC;
  Parse *pParse = pNC->pParse;
  SrcList *pSrcList = pNC->pSrcList;
  AggInfo *pAggInfo = pNC->uNC.pAggInfo;

  assert( pNC->ncFlags & NC_UAggInfo );
  switch( pExpr->op ){
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      /* Check to see if the column is in one of the tables in the FROM
      ** clause of the aggregate query */
      if( ALWAYS(pSrcList!=0) ){
        struct SrcList_item *pItem = pSrcList->a;
        for(i=0; i<pSrcList->nSrc; i++, pItem++){
          struct AggInfo_col *pCol;
          assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
          if( pExpr->iTable==pItem->iCursor ){
            /* If we reach this point, it means that pExpr refers to a table
            ** that is in the FROM clause of the aggregate query.  
            **
            ** Make an entry for the column in pAggInfo->aCol[] if there
            ** is not an entry there already.
            */
            int k;
            pCol = pAggInfo->aCol;
            for(k=0; k<pAggInfo->nColumn; k++, pCol++){
              if( pCol->iTable==pExpr->iTable &&
                  pCol->iColumn==pExpr->iColumn ){
                break;
              }
            }
            if( (k>=pAggInfo->nColumn)
             && (k = addAggInfoColumn(pParse->db, pAggInfo))>=0 
            ){
              pCol = &pAggInfo->aCol[k];
              pCol->pTab = pExpr->y.pTab;
              pCol->iTable = pExpr->iTable;
              pCol->iColumn = pExpr->iColumn;
              pCol->iMem = ++pParse->nMem;
              pCol->iSorterColumn = -1;
              pCol->pExpr = pExpr;
              if( pAggInfo->pGroupBy ){
                int j, n;
                ExprList *pGB = pAggInfo->pGroupBy;
                struct ExprList_item *pTerm = pGB->a;
                n = pGB->nExpr;
                for(j=0; j<n; j++, pTerm++){
                  Expr *pE = pTerm->pExpr;
                  if( pE->op==TK_COLUMN && pE->iTable==pExpr->iTable &&
                      pE->iColumn==pExpr->iColumn ){
                    pCol->iSorterColumn = j;
                    break;
                  }
                }
              }
              if( pCol->iSorterColumn<0 ){
                pCol->iSorterColumn = pAggInfo->nSortingColumn++;
              }
            }
            /* There is now an entry for pExpr in pAggInfo->aCol[] (either
            ** because it was there before or because we just created it).
            ** Convert the pExpr to be a TK_AGG_COLUMN referring to that
            ** pAggInfo->aCol[] entry.
            */
            ExprSetVVAProperty(pExpr, EP_NoReduce);
            pExpr->pAggInfo = pAggInfo;
            pExpr->op = TK_AGG_COLUMN;
            pExpr->iAgg = (i16)k;
            break;
          } /* endif pExpr->iTable==pItem->iCursor */
        } /* end loop over pSrcList */
      }
      return WRC_Prune;
    }
    case TK_AGG_FUNCTION: {
      if( (pNC->ncFlags & NC_InAggFunc)==0
       && pWalker->walkerDepth==pExpr->op2
      ){
        /* Check to see if pExpr is a duplicate of another aggregate 
        ** function that is already in the pAggInfo structure
        */
        struct AggInfo_func *pItem = pAggInfo->aFunc;
        for(i=0; i<pAggInfo->nFunc; i++, pItem++){
          if( sqlite3ExprCompare(0, pItem->pExpr, pExpr, -1)==0 ){
            break;
          }
        }
        if( i>=pAggInfo->nFunc ){
          /* pExpr is original.  Make a new entry in pAggInfo->aFunc[]
          */
          u8 enc = ENC(pParse->db);
          i = addAggInfoFunc(pParse->db, pAggInfo);
          if( i>=0 ){
            assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
            pItem = &pAggInfo->aFunc[i];
            pItem->pExpr = pExpr;
            pItem->iMem = ++pParse->nMem;
            assert( !ExprHasProperty(pExpr, EP_IntValue) );
            pItem->pFunc = sqlite3FindFunction(pParse->db,
                   pExpr->u.zToken, 
                   pExpr->x.pList ? pExpr->x.pList->nExpr : 0, enc, 0);
            if( pExpr->flags & EP_Distinct ){
              pItem->iDistinct = pParse->nTab++;
            }else{
              pItem->iDistinct = -1;
            }
          }
        }
        /* Make pExpr point to the appropriate pAggInfo->aFunc[] entry
        */
        assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
        ExprSetVVAProperty(pExpr, EP_NoReduce);
        pExpr->iAgg = (i16)i;
        pExpr->pAggInfo = pAggInfo;
        return WRC_Prune;
      }else{
        return WRC_Continue;
      }
    }
  }
  return WRC_Continue;
}